

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O1

void Lcr_ManFree(Fra_Lcr_t *p)

{
  void *__ptr;
  long lVar1;
  Vec_Ptr_t *pVVar2;
  
  if (p->fVerbose != 0) {
    Lcr_ManPrint(p);
  }
  pVVar2 = p->pAig->vCis;
  if (0 < pVVar2->nSize) {
    lVar1 = 0;
    do {
      *(undefined8 *)pVVar2->pArray[lVar1] = 0;
      lVar1 = lVar1 + 1;
      pVVar2 = p->pAig->vCis;
    } while (lVar1 < pVVar2->nSize);
  }
  pVVar2 = p->vFraigs;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  if (p->pCla != (Fra_Cla_t *)0x0) {
    Fra_ClassesStop(p->pCla);
  }
  pVVar2 = p->vParts;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar2->nSize) {
      lVar1 = 0;
      do {
        __ptr = pVVar2->pArray[lVar1];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          free(__ptr);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    free(pVVar2);
  }
  if (p->pInToOutPart != (int *)0x0) {
    free(p->pInToOutPart);
    p->pInToOutPart = (int *)0x0;
  }
  if (p->pInToOutNum != (int *)0x0) {
    free(p->pInToOutNum);
    p->pInToOutNum = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Lcr_ManFree( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->fVerbose )
        Lcr_ManPrint( p );
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pNext = NULL;
    Vec_PtrFree( p->vFraigs );
    if ( p->pCla  )     Fra_ClassesStop( p->pCla );
    if ( p->vParts  )   Vec_VecFree( (Vec_Vec_t *)p->vParts );
    ABC_FREE( p->pInToOutPart );
    ABC_FREE( p->pInToOutNum );
    ABC_FREE( p );
}